

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sleep.c
# Opt level: O3

void nn_sleep(int milliseconds)

{
  int iVar1;
  timespec ts;
  timespec local_10;
  
  local_10.tv_sec = (__time_t)(milliseconds / 1000);
  local_10.tv_nsec = (long)((milliseconds % 1000) * 1000000);
  iVar1 = nanosleep(&local_10,(timespec *)0x0);
  if (iVar1 == 0) {
    return;
  }
  nn_sleep_cold_1();
}

Assistant:

void nn_sleep (int milliseconds)
{
    int rc;
    struct timespec ts;

    ts.tv_sec = milliseconds / 1000;
    ts.tv_nsec = milliseconds % 1000 * 1000000;
    rc = nanosleep (&ts, NULL);
    errno_assert (rc == 0);    
}